

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvalContext.cpp
# Opt level: O1

bool __thiscall slang::ast::EvalContext::step(EvalContext *this,SourceLocation loc)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = this->steps + 1;
  this->steps = uVar2;
  uVar1 = (((this->astCtx).scope.ptr)->compilation->options).maxConstexprSteps;
  if (uVar1 <= uVar2) {
    addDiag(this,(DiagCode)0xb000c,loc);
  }
  return uVar2 < uVar1;
}

Assistant:

bool EvalContext::step(SourceLocation loc) {
    if (++steps < getCompilation().getOptions().maxConstexprSteps)
        return true;

    addDiag(diag::ConstEvalExceededMaxSteps, loc);
    return false;
}